

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxInputManager.cpp
# Opt level: O2

void __thiscall
OIS::LinuxInputManager::_parseConfigSettings(LinuxInputManager *this,ParamList *paramList)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  iterator iVar3;
  ulonglong uVar4;
  allocator local_41;
  key_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,"WINDOW",&local_41);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&paramList->_M_t,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = &(paramList->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    puts("OIS: No Window specified... Not using x11 keyboard/mouse");
  }
  else {
    uVar4 = strtoull(*(char **)(iVar3._M_node + 2),(char **)0x0,10);
    this->window = uVar4;
    std::__cxx11::string::string((string *)&local_40,"x11_keyboard_grab",&local_41);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&paramList->_M_t,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (iVar3._M_node + 2),"false");
      if (bVar2) {
        this->grabKeyboard = false;
      }
    }
    std::__cxx11::string::string((string *)&local_40,"x11_mouse_grab",&local_41);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&paramList->_M_t,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (iVar3._M_node + 2),"false");
      if (bVar2) {
        this->grabMouse = false;
      }
    }
    std::__cxx11::string::string((string *)&local_40,"x11_mouse_hide",&local_41);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&paramList->_M_t,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (iVar3._M_node + 2),"false");
      if (bVar2) {
        this->hideMouse = false;
      }
    }
  }
  return;
}

Assistant:

void LinuxInputManager::_parseConfigSettings(ParamList& paramList)
{
	ParamList::iterator i = paramList.find("WINDOW");
	if(i == paramList.end())
	{
		printf("OIS: No Window specified... Not using x11 keyboard/mouse\n");
		return;
	}

	window = strtoull(i->second.c_str(), 0, 10);

	//--------- Keyboard Settings ------------//
	i = paramList.find("x11_keyboard_grab");
	if(i != paramList.end())
		if(i->second == "false")
			grabKeyboard = false;

	//--------- Mouse Settings ------------//
	i = paramList.find("x11_mouse_grab");
	if(i != paramList.end())
		if(i->second == "false")
			grabMouse = false;

	i = paramList.find("x11_mouse_hide");
	if(i != paramList.end())
		if(i->second == "false")
			hideMouse = false;
}